

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_v6addr_is_local_(in6_addr *in)

{
  bool local_19;
  uchar *addr;
  in6_addr *in_local;
  
  local_19 = true;
  if ((((*(long *)&in->__in6_u != 0) &&
       (local_19 = true, ((in->__in6_u).__u6_addr8[0] & 0xfe) != 0xfc)) &&
      (((in->__in6_u).__u6_addr8[0] != 0xfe ||
       (local_19 = true, ((in->__in6_u).__u6_addr8[1] & 0xc0) != 0x80)))) &&
     (((in->__in6_u).__u6_addr8[0] != 0xfe ||
      (local_19 = true, ((in->__in6_u).__u6_addr8[1] & 0xc0) != 0xc0)))) {
    local_19 = (in->__in6_u).__u6_addr8[0] == 0xff;
  }
  return (int)local_19;
}

Assistant:

int
evutil_v6addr_is_local_(const struct in6_addr *in)
{
	static const char ZEROES[] =
		"\x00\x00\x00\x00\x00\x00\x00\x00"
		"\x00\x00\x00\x00\x00\x00\x00\x00";

	const unsigned char *addr = (const unsigned char *)in->s6_addr;
	return !memcmp(addr, ZEROES, 8) ||
		((addr[0] & 0xfe) == 0xfc) ||
		(addr[0] == 0xfe && (addr[1] & 0xc0) == 0x80) ||
		(addr[0] == 0xfe && (addr[1] & 0xc0) == 0xc0) ||
		(addr[0] == 0xff);
}